

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_encoding.c
# Opt level: O1

int hdr_base64_decode(char *input,size_t input_len,uint8_t *output,size_t output_len)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = -0x16;
  if (((input_len & 3) == 0 && 3 < input_len) && ((input_len >> 2) * 3 == output_len)) {
    iVar1 = 0;
    uVar2 = 0;
    do {
      hdr_base64_decode_block(input + uVar2,output);
      uVar2 = uVar2 + 4;
      output = output + 3;
    } while (uVar2 < input_len);
  }
  return iVar1;
}

Assistant:

int hdr_base64_decode(
    const char* input, size_t input_len, uint8_t* output, size_t output_len)
{
    size_t i, j;

    if (input_len < 4 ||
        (input_len & 3u) != 0 ||
        (input_len / 4) * 3 != output_len)
    {
        return -EINVAL;
    }

    for (i = 0, j = 0; i < input_len; i += 4, j += 3)
    {
        hdr_base64_decode_block(&input[i], &output[j]);
    }

    return 0;
}